

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

index_t __thiscall
GEO::Delaunay3dThread::stellate_conflict_zone_iterative
          (Delaunay3dThread *this,index_t v_in,index_t t1,index_t t1fbord,index_t t1fprev)

{
  int iVar1;
  pointer pFVar2;
  pointer piVar3;
  pointer pFVar4;
  uint8 uVar5;
  index_t iVar6;
  uint8 uVar7;
  bool bVar8;
  index_t iVar9;
  ulong uVar10;
  uint uVar11;
  index_t t1_00;
  index_t iVar12;
  uint uVar13;
  index_t t1fborder;
  index_t t2ft1;
  index_t t2;
  index_t t2fbord;
  uint local_58;
  index_t local_54 [2];
  index_t local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint8 local_3c [4];
  StellateConflictStack *local_38;
  
  local_38 = &this->S2_;
  local_4c = v_in;
  std::
  vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  ::resize(&local_38->store_,
           ((long)(this->S2_).store_.
                  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->S2_).store_.
                  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 1);
  pFVar2 = (this->S2_).store_.
           super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar2[-1].t1 = t1;
  pFVar2[-1].t1fbord = (uint8)t1fbord;
  pFVar2[-1].t1fprev = (uint8)t1fprev;
  do {
    pFVar2 = (this->S2_).store_.
             super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t1_00 = pFVar2[-1].t1;
    t1fborder = (index_t)pFVar2[-1].t1fbord;
    uVar11 = (uint)pFVar2[-1].t1fprev;
    uVar10 = (ulong)(t1_00 * 4);
    piVar3 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[uVar10];
    local_40 = piVar3[uVar10 + 1];
    local_44 = piVar3[uVar10 + 2];
    local_48 = piVar3[uVar10 + 3];
    iVar9 = new_tetrahedron(this);
    uVar10 = (ulong)(iVar9 * 4);
    piVar3 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[uVar10] = iVar1;
    piVar3[uVar10 + 1] = local_40;
    piVar3[uVar10 + 2] = local_44;
    piVar3[uVar10 + 3] = local_48;
    uVar13 = t1fborder + iVar9 * 4;
    piVar3[uVar13] = local_4c;
    piVar3 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             ).super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[t1fborder + t1_00 * 4];
    piVar3[uVar13] = iVar1;
    uVar10 = (ulong)(uint)(iVar1 * 4);
    piVar3[((uint)(piVar3[uVar10 + 1] == t1_00) + (uint)(piVar3[uVar10 + 2] == t1_00) * 2 |
           (uint)(piVar3[uVar10 + 3] == t1_00) * 3) + iVar1 * 4] = iVar9;
    uVar13 = 0;
LAB_00182042:
    if (3 < uVar13) {
      pFVar2 = (this->S2_).store_.
               super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar4 = (this->S2_).store_.
               super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->S2_).store_.
      super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar4 + -1;
      if (pFVar2 == pFVar4 + -1) {
        return iVar9;
      }
      t1_00 = pFVar4[-2].t1;
      t1fborder = (index_t)pFVar4[-2].t1fbord;
      uVar11 = (uint)pFVar4[-2].t1fprev;
      uVar13 = (uint)pFVar4[-2].t1ft2;
      local_58 = (uint)pFVar4[-2].t2ft1;
      iVar12 = pFVar4[-2].new_t;
      local_54[0] = iVar9;
LAB_001820f6:
      piVar3 = (this->cell_to_cell_store_->
               super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3[local_54[0] * 4 + local_58] = iVar12;
      piVar3[uVar13 + iVar12 * 4] = local_54[0];
      iVar9 = iVar12;
LAB_0018211d:
      uVar13 = uVar13 + 1;
      goto LAB_00182042;
    }
    if ((uVar13 == uVar11) ||
       ((this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
        super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13 + iVar9 * 4] != -1)) goto LAB_0018211d;
    bVar8 = get_neighbor_along_conflict_zone_border
                      (this,t1_00,t1fborder,uVar13,local_54,(index_t *)local_3c,&local_58);
    uVar7 = local_3c[0];
    iVar6 = local_54[0];
    iVar12 = iVar9;
    if (bVar8) goto LAB_001820f6;
    uVar5 = (uint8)local_58;
    pFVar2 = (this->S2_).store_.
             super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar2[-1].new_t = iVar9;
    pFVar2[-1].t1ft2 = (uint8)uVar13;
    pFVar2[-1].t2ft1 = (uint8)local_58;
    std::
    vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
    ::resize(&local_38->store_,
             ((long)pFVar2 -
              (long)(this->S2_).store_.
                    super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 1);
    pFVar2 = (this->S2_).store_.
             super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar2[-1].t1 = iVar6;
    pFVar2[-1].t1fbord = uVar7;
    pFVar2[-1].t1fprev = uVar5;
  } while( true );
}

Assistant:

index_t stellate_conflict_zone_iterative(
            index_t v_in, index_t t1, index_t t1fbord,
            index_t t1fprev = index_t(-1)
        ) {
            //   This function is de-recursified because some degenerate
            // inputs can cause stack overflow (system stack is limited to
            // a few megs). For instance, it can happen when a large number
            // of points are on the same sphere exactly.
            
            //   To de-recursify, it uses class StellateConflictStack
            // that emulates system's stack for storing functions's
            // parameters and local variables in all the nested stack
            // frames. 
        
            signed_index_t v = signed_index_t(v_in);
            
            S2_.push(t1, t1fbord, t1fprev);
            
            index_t new_t;   // the newly created tetrahedron.
            
            index_t t1ft2;   // traverses the 4 facets of t1.
            
            index_t t2;      // the tetrahedron on the border of
                             // the conflict zone that shares an
                             // edge with t1 along t1ft2.
            
            index_t t2fbord; // the facet of t2 on the border of
                             // the conflict zone.
        
            index_t t2ft1;   // the facet of t2 that is incident to t1.
        
        entry_point:
            S2_.get_parameters(t1, t1fbord, t1fprev);


            geo_debug_assert(owns_tet(t1));
            geo_debug_assert(tet_adjacent(t1,t1fbord)>=0);
            geo_debug_assert(owns_tet(index_t(tet_adjacent(t1,t1fbord))));
            geo_debug_assert(tet_is_marked_as_conflict(t1));
            geo_debug_assert(
                !tet_is_marked_as_conflict(index_t(tet_adjacent(t1,t1fbord)))
            );

            // Create new tetrahedron with same vertices as t_bndry
            new_t = new_tetrahedron(
                tet_vertex(t1,0),
                tet_vertex(t1,1),
                tet_vertex(t1,2),
                tet_vertex(t1,3)
            );

            // Replace in new_t the vertex opposite to t1fbord with v
            set_tet_vertex(new_t, t1fbord, v);
            
            // Connect new_t with t1's neighbor accros t1fbord
            {
                index_t tbord = index_t(tet_adjacent(t1,t1fbord));
                set_tet_adjacent(new_t, t1fbord, tbord);
                set_tet_adjacent(tbord, find_tet_adjacent(tbord,t1), new_t);
            }
            
            //  Lookup new_t's neighbors accros its three other
            // facets and connect them
            for(t1ft2=0; t1ft2<4; ++t1ft2) {
                
                if(t1ft2 == t1fprev || tet_adjacent(new_t,t1ft2) != -1) {
                    continue;
                }
                
                // Get t1's neighbor along the border of the conflict zone
                if(!get_neighbor_along_conflict_zone_border(
                       t1,t1fbord,t1ft2, t2,t2fbord,t2ft1
                )) {
                    //   If t1's neighbor is not a new tetrahedron,
                    // create a new tetrahedron through a recursive call.
                    S2_.save_locals(new_t, t1ft2, t2ft1);
                    S2_.push(t2, t2fbord, t2ft1);
                    goto entry_point;

                return_point:
                    // This is the return value of the called function.
                    index_t result = new_t;
                    S2_.pop();
                    
                    // Special case: we were in the outermost frame, 
                    // then we (truly) return from the function.
                    if(S2_.empty()) {
                        return result;
                    }
                    
                    S2_.get_parameters(t1, t1fbord, t1fprev);
                    S2_.get_locals(new_t, t1ft2, t2ft1); 
                    t2 = result; 
                }
                
                set_tet_adjacent(t2, t2ft1, new_t);
                set_tet_adjacent(new_t, t1ft2, t2);
            }

            // Except for the initial call (see "Special case" above),
            // the nested calls all come from the same location,
            // thus there is only one possible return point
            // (no need to push any return address).
            goto return_point;
        }